

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlNsDumpOutput(xmlOutputBufferPtr buf,xmlNsPtr cur,xmlSaveCtxtPtr ctxt)

{
  int iVar1;
  uint local_24;
  uint escapeFlags;
  xmlSaveCtxtPtr ctxt_local;
  xmlNsPtr cur_local;
  xmlOutputBufferPtr buf_local;
  
  local_24 = 1;
  if ((cur != (xmlNsPtr)0x0) && (buf != (xmlOutputBufferPtr)0x0)) {
    if ((ctxt == (xmlSaveCtxtPtr)0x0) || (ctxt->encoding == (xmlChar *)0x0)) {
      local_24 = 3;
    }
    if (((cur->type == XML_NAMESPACE_DECL) && (cur->href != (xmlChar *)0x0)) &&
       (iVar1 = xmlStrEqual(cur->prefix,(xmlChar *)"xml"), iVar1 == 0)) {
      if ((ctxt == (xmlSaveCtxtPtr)0x0) || (ctxt->format != 2)) {
        xmlOutputBufferWrite(buf,1," ");
      }
      else {
        xmlOutputBufferWriteWSNonSig(ctxt,2);
      }
      if (cur->prefix == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,5,"xmlns");
      }
      else {
        xmlOutputBufferWrite(buf,6,"xmlns:");
        xmlOutputBufferWriteString(buf,(char *)cur->prefix);
      }
      xmlOutputBufferWrite(buf,2,"=\"");
      xmlSerializeText(buf,cur->href,local_24);
      xmlOutputBufferWrite(buf,1,"\"");
    }
  }
  return;
}

Assistant:

static void
xmlNsDumpOutput(xmlOutputBufferPtr buf, xmlNsPtr cur, xmlSaveCtxtPtr ctxt) {
    unsigned escapeFlags = XML_ESCAPE_ATTR;

    if ((cur == NULL) || (buf == NULL)) return;

    if ((ctxt == NULL) || (ctxt->encoding == NULL))
        escapeFlags |= XML_ESCAPE_NON_ASCII;

    if ((cur->type == XML_LOCAL_NAMESPACE) && (cur->href != NULL)) {
	if (xmlStrEqual(cur->prefix, BAD_CAST "xml"))
	    return;

	if (ctxt != NULL && ctxt->format == 2)
	    xmlOutputBufferWriteWSNonSig(ctxt, 2);
	else
	    xmlOutputBufferWrite(buf, 1, " ");

        /* Within the context of an element attributes */
	if (cur->prefix != NULL) {
	    xmlOutputBufferWrite(buf, 6, "xmlns:");
	    xmlOutputBufferWriteString(buf, (const char *)cur->prefix);
	} else
	    xmlOutputBufferWrite(buf, 5, "xmlns");
        xmlOutputBufferWrite(buf, 2, "=\"");
        xmlSerializeText(buf, cur->href, escapeFlags);
        xmlOutputBufferWrite(buf, 1, "\"");
    }
}